

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O1

int hostkey_method_ssh_rsa_initPEM
              (LIBSSH2_SESSION *session,char *privkeyfile,uchar *passphrase,void **abstract)

{
  int iVar1;
  int iVar2;
  EVP_PKEY *in_RAX;
  EVP_PKEY *rsactx;
  EVP_PKEY *local_28;
  
  local_28 = in_RAX;
  if ((EVP_PKEY *)*abstract != (EVP_PKEY *)0x0) {
    EVP_PKEY_free((EVP_PKEY *)*abstract);
    *abstract = (void *)0x0;
  }
  iVar1 = _libssh2_rsa_new_private(&local_28,session,privkeyfile,passphrase);
  iVar2 = -1;
  if (iVar1 == 0) {
    *abstract = local_28;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
hostkey_method_ssh_rsa_initPEM(LIBSSH2_SESSION * session,
                               const char *privkeyfile,
                               unsigned const char *passphrase,
                               void **abstract)
{
    libssh2_rsa_ctx *rsactx;
    int ret;

    if(*abstract) {
        hostkey_method_ssh_rsa_dtor(session, abstract);
        *abstract = NULL;
    }

    ret = _libssh2_rsa_new_private(&rsactx, session, privkeyfile, passphrase);
    if(ret) {
        return -1;
    }

    *abstract = rsactx;

    return 0;
}